

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_model.cpp
# Opt level: O3

void __thiscall
DCACHE::dc_simulate_write
          (DCACHE *this,oraddr_t dataaddr,oraddr_t virt_addr,uint32_t data,int width,int data_ci)

{
  CPU *pCVar1;
  oraddr_t oVar2;
  int iVar3;
  BUS_DEVICE *pBVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  byte bVar14;
  uint *local_38;
  
  uVar11 = (ulong)dataaddr;
  pBVar4 = BUS::get_device((this->super_CACHE).bus_p,dataaddr);
  if (width == 4) {
    (*pBVar4->_vptr_BUS_DEVICE[5])(pBVar4,uVar11,(ulong)virt_addr,(ulong)data);
  }
  else if (width == 1) {
    (*pBVar4->_vptr_BUS_DEVICE[3])(pBVar4,uVar11,(ulong)virt_addr,(ulong)data & 0xff);
  }
  else if (width == 2) {
    (*pBVar4->_vptr_BUS_DEVICE[4])(pBVar4,uVar11,(ulong)virt_addr,(ulong)data & 0xffff);
  }
  pCVar1 = (this->super_CACHE).cpu;
  if ((pCVar1->sprs[1] & 2) == 0) {
    return;
  }
  if (data_ci != 0) {
    return;
  }
  if ((pCVar1->sprs[0x11] & 8) == 0) {
    return;
  }
  uVar8 = (ulong)(this->super_CACHE).nways;
  uVar5 = (this->super_CACHE).blocksize;
  uVar12 = (ulong)(this->super_CACHE).nsets;
  iVar7 = (int)((uVar11 / uVar5) % uVar12);
  oVar2 = (oraddr_t)((uVar11 / uVar5) / uVar12);
  if (uVar8 == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = 0xffffffff;
    uVar12 = 0;
    do {
      if (this->cache_mem[uVar12].cache_set[iVar7].tagaddr == oVar2) {
        uVar11 = uVar12 & 0xffffffff;
      }
      uVar12 = uVar12 + 1;
    } while (uVar8 != uVar12);
    if (-1 < (int)uVar11) {
      if (uVar8 != 0) {
        lVar13 = 0;
        do {
          iVar3 = this->cache_mem[lVar13].cache_set[iVar7].lru;
          if (this->cache_mem[uVar11].cache_set[iVar7].lru < iVar3) {
            this->cache_mem[lVar13].cache_set[iVar7].lru = iVar3 + -1;
          }
          lVar13 = lVar13 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      uVar6 = uVar5 - 1 & dataaddr;
      this->cache_mem[uVar11].cache_set[iVar7].lru = (this->super_CACHE).ustates - 1;
      uVar5 = data;
      if (width != 4) {
        uVar5 = *(uint *)((long)this->cache_mem[uVar11].cache_set[iVar7].line +
                         (ulong)(uVar6 & 0xfffffffc));
        if (width == 1) {
          bVar14 = ~(byte)(dataaddr << 3) & 0x18;
          uVar10 = data & 0xff;
          uVar9 = ~(0xff << bVar14);
        }
        else {
          if (width != 2) goto LAB_001047d5;
          bVar14 = (byte)(dataaddr << 3) & 0x10;
          uVar10 = data & 0xffff;
          uVar9 = 0xffff << bVar14;
          bVar14 = bVar14 ^ 0x10;
        }
        uVar5 = uVar10 << bVar14 | uVar5 & uVar9;
      }
LAB_001047d5:
      this->cache_mem[uVar11].cache_set[iVar7].line[uVar6 >> 2] = uVar5;
      return;
    }
    uVar11 = 0;
    if (uVar8 != 0) {
      uVar12 = 0;
      do {
        if (this->cache_mem[uVar12].cache_set[iVar7].lru < (int)((this->super_CACHE).ustates - 1)) {
          uVar11 = uVar12 & 0xffffffff;
        }
        uVar12 = uVar12 + 1;
      } while (uVar8 != uVar12);
      uVar11 = (ulong)(int)uVar11;
    }
  }
  local_38 = &(this->super_CACHE).ustates;
  uVar6 = 0;
  do {
    uVar9 = (dataaddr & 0xfffffffc) + uVar6;
    pBVar4 = BUS::get_device((this->super_CACHE).bus_p,(uVar5 - 1 & uVar9) + (-uVar5 & dataaddr));
    uVar5 = (this->super_CACHE).blocksize;
    iVar3 = (*pBVar4->_vptr_BUS_DEVICE[2])
                      (pBVar4,(ulong)((uVar5 - 1 & uVar9) + (-uVar5 & dataaddr)),0);
    *(int *)((long)this->cache_mem[uVar11].cache_set[iVar7].line +
            (ulong)((this->super_CACHE).blocksize - 1 & dataaddr + uVar6 & 0xfffffffc)) = iVar3;
    uVar6 = uVar6 + 4;
    uVar5 = (this->super_CACHE).blocksize;
  } while (uVar6 < uVar5);
  uVar12 = (ulong)(this->super_CACHE).nways;
  this->cache_mem[uVar11].cache_set[iVar7].tagaddr = oVar2;
  if (uVar12 != 0) {
    lVar13 = 0;
    do {
      iVar3 = this->cache_mem[lVar13].cache_set[iVar7].lru;
      if (iVar3 != 0) {
        this->cache_mem[lVar13].cache_set[iVar7].lru = iVar3 + -1;
      }
      lVar13 = lVar13 + 1;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  this->cache_mem[uVar11].cache_set[iVar7].lru = *local_38 - 1;
  return;
}

Assistant:

void DCACHE::dc_simulate_write(oraddr_t dataaddr, oraddr_t virt_addr, uint32_t data, int width, int data_ci)
{
    int set, way = -1;
    int i;
    oraddr_t tagaddr;
    uint32_t tmp;
    BUS_DEVICE * device;
    device = bus_p->get_device(dataaddr);

    if (width == 4)
        device->Write32(dataaddr, virt_addr, data);
    else if (width == 2)
        device->Write16(dataaddr, virt_addr, data);
    else if (width == 1)
        device->Write8(dataaddr, virt_addr, data);

    if (!(cpu->sprs[SPR_UPR] & SPR_UPR_DCP) ||
        !(cpu->sprs[SPR_SR] & SPR_SR_DCE) || data_ci)
        return;

    /* Which set to check out? */
    set = (dataaddr / blocksize) % nsets;
    tagaddr = (dataaddr / blocksize) / nsets;

    /* Scan all ways and try to find a matching way. */
    for (i = 0; i < nways; i++)
        if (cache_mem[i].cache_set[set].tagaddr == tagaddr)
            way = i;
    
    /* Did we find our cached data? */
    if (way >= 0)
    { /* Yes, we did. */
        // dc_stats.writehit++;

        for (i = 0; i < nways; i++)
            if (cache_mem[i].cache_set[set].lru > cache_mem[way].cache_set[set].lru)
                cache_mem[i].cache_set[set].lru--;
        cache_mem[way].cache_set[set].lru = ustates - 1;
        // runtime.sim.mem_cycles += store_hitdelay;

        tmp =
            cache_mem[way].cache_set[set].line[(dataaddr & (blocksize - 1)) >> 2];
        if (width == 4)
            tmp = data;
        else if (width == 2)
        {
            tmp &= 0xffff << ((dataaddr & 2) ? 16 : 0);
            tmp |= (data & 0xffff) << ((dataaddr & 2) ? 0 : 16);
        }
        else if (width == 1)
        {
            tmp &= ~(0xff << (8 * (3 - (dataaddr & 3))));
            tmp |= (data & 0xff) << (8 * (3 - (dataaddr & 3)));
        }
        cache_mem[way].cache_set[set].line[(dataaddr & (blocksize - 1)) >> 2] =
            tmp;
    }
    else
    { /* No, we didn't. */
        int minlru = ustates - 1;
        int minway = 0;

        // dc_stats.writemiss++;

        for (i = 0; i < nways; i++)
            if (cache_mem[i].cache_set[set].lru < minlru)
                minway = i;

        for (i = 0; i < (blocksize); i += 4)
        {
            device = bus_p->get_device((dataaddr & ~(blocksize - 1)) + (((dataaddr & ~3ul) + i) & (blocksize -1)));
            cache_mem[minway].cache_set[set].line[((dataaddr + i) & (blocksize - 1)) >> 2] =
                /* FIXME: Same comment as in dc_simulate_read */
                device->Read32((dataaddr & ~(blocksize - 1)) + (((dataaddr & ~3ul) + i) & (blocksize -1)), 0);

        }

        cache_mem[minway].cache_set[set].tagaddr = tagaddr;
        for (i = 0; i < nways; i++)
            if (cache_mem[i].cache_set[set].lru)
                cache_mem[i].cache_set[set].lru--;
        cache_mem[minway].cache_set[set].lru = ustates - 1;
        // runtime.sim.mem_cycles += store_missdelay;

        // if (config.pcu.enabled)
        //     pcu_count_event(SPR_PCMR_DCM);
    }
}